

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

pair<int,_float> * __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
get_data<directed_flag_complex_boundary_cell_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,int dimension,
          directed_flag_complex_boundary_cell_t *vertices)

{
  vertex_index_t vVar1;
  pair<int,_float> *ppVar2;
  directed_flag_complex_boundary_cell_t *in_RDX;
  directed_flag_complex_boundary_cell_t *in_RDI;
  int in_stack_00000024;
  directed_flag_complex_boundary_cell_t *in_stack_00000028;
  int in_stack_00000034;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *in_stack_00000038;
  
  vVar1 = directed_flag_complex_cell_t::operator[]
                    (&in_RDI->super_directed_flag_complex_cell_t,(size_t)in_RDX);
  std::
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ::operator[]((vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                *)in_RDI,(ulong)vVar1);
  directed_flag_complex_boundary_cell_t::directed_flag_complex_boundary_cell_t(in_RDI,in_RDX);
  ppVar2 = directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
           get_data<directed_flag_complex_boundary_cell_t>
                     (in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024);
  return ppVar2;
}

Assistant:

const ExtraData& get_data(int dimension, const Cell vertices) const {
		return vertex_cells[vertices[0]].get_data(dimension, vertices);
	}